

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_rx(tftp_state_data *state,tftp_event_t event)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  uint uVar3;
  time_t tVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  char local_138 [8];
  char buffer [256];
  Curl_easy *data;
  int rblock;
  ssize_t sbytes;
  tftp_event_t event_local;
  tftp_state_data *state_local;
  
  buffer._248_8_ = state->data;
  switch(event) {
  case TFTP_EVENT_DATA:
    uVar2 = getrpacketblock(&state->rpacket);
    uVar3 = (uint)uVar2;
    if ((state->block + 1 & 0xffff) == uVar3) {
      state->retries = 0;
    }
    else {
      if (state->block != uVar3) {
        if (buffer._248_8_ == 0) {
          return CURLE_OK;
        }
        if ((*(ulong *)(buffer._248_8_ + 0xa34) >> 0x1e & 1) == 0) {
          return CURLE_OK;
        }
        if ((*(long *)(buffer._248_8_ + 0x1318) != 0) &&
           (*(int *)(*(long *)(buffer._248_8_ + 0x1318) + 8) < 1)) {
          return CURLE_OK;
        }
        Curl_infof((Curl_easy *)buffer._248_8_,
                   "Received unexpected DATA packet block %d, expecting block %d",(ulong)uVar3,
                   (ulong)(state->block + 1 & 0xffff));
        return CURLE_OK;
      }
      if (((buffer._248_8_ != 0) && ((*(ulong *)(buffer._248_8_ + 0xa34) >> 0x1e & 1) != 0)) &&
         ((*(long *)(buffer._248_8_ + 0x1318) == 0 ||
          (0 < *(int *)(*(long *)(buffer._248_8_ + 0x1318) + 8))))) {
        Curl_infof((Curl_easy *)buffer._248_8_,"Received last DATA packet block %d again.",
                   (ulong)uVar3);
      }
    }
    state->block = uVar2;
    setpacketevent(&state->spacket,4);
    setpacketblock(&state->spacket,state->block);
    sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    uVar1 = buffer._248_8_;
    if (sVar5 < 0) {
      piVar6 = __errno_location();
      pcVar7 = Curl_strerror(*piVar6,local_138,0x100);
      Curl_failf((Curl_easy *)uVar1,"%s",pcVar7);
      return CURLE_SEND_ERROR;
    }
    if ((long)state->rbytes < (long)((ulong)state->blksize + 4)) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    tVar4 = time((time_t *)0x0);
    state->rx_time = tVar4;
    break;
  default:
    Curl_failf((Curl_easy *)buffer._248_8_,"%s","tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL;
  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket,5);
    setpacketblock(&state->spacket,state->block);
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    break;
  case TFTP_EVENT_OACK:
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket,4);
    setpacketblock(&state->spacket,state->block);
    sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    uVar1 = buffer._248_8_;
    if (sVar5 < 0) {
      piVar6 = __errno_location();
      pcVar7 = Curl_strerror(*piVar6,local_138,0x100);
      Curl_failf((Curl_easy *)uVar1,"%s",pcVar7);
      return CURLE_SEND_ERROR;
    }
    state->state = TFTP_STATE_RX;
    tVar4 = time((time_t *)0x0);
    state->rx_time = tVar4;
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    if ((((Curl_easy *)buffer._248_8_ != (Curl_easy *)0x0) &&
        ((*(ulong *)&(((Curl_easy *)buffer._248_8_)->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((((Curl_easy *)buffer._248_8_)->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((((Curl_easy *)buffer._248_8_)->state).feat)->log_level)))) {
      Curl_infof((Curl_easy *)buffer._248_8_,"Timeout waiting for block %d ACK. Retries = %d",
                 (ulong)(state->block + 1 & 0xffff),(ulong)(uint)state->retries);
    }
    if (state->retry_max < state->retries) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                     state->remote_addrlen);
      uVar1 = buffer._248_8_;
      if (sVar5 < 0) {
        piVar6 = __errno_location();
        pcVar7 = Curl_strerror(*piVar6,local_138,0x100);
        Curl_failf((Curl_easy *)uVar1,"%s",pcVar7);
        return CURLE_SEND_ERROR;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_rx(struct tftp_state_data *state,
                        tftp_event_t event)
{
  ssize_t sbytes;
  int rblock;
  struct Curl_easy *data = state->data;
  char buffer[STRERROR_LEN];

  switch(event) {

  case TFTP_EVENT_DATA:
    /* Is this the block we expect? */
    rblock = getrpacketblock(&state->rpacket);
    if(NEXT_BLOCKNUM(state->block) == rblock) {
      /* This is the expected block. Reset counters and ACK it. */
      state->retries = 0;
    }
    else if(state->block == rblock) {
      /* This is the last recently received block again. Log it and ACK it
         again. */
      infof(data, "Received last DATA packet block %d again.", rblock);
    }
    else {
      /* totally unexpected, just log it */
      infof(data,
            "Received unexpected DATA packet block %d, expecting block %d",
            rblock, NEXT_BLOCKNUM(state->block));
      break;
    }

    /* ACK this block. */
    state->block = (unsigned short)rblock;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* Check if completed (That is, a less than full packet is received) */
    if(state->rbytes < (ssize_t)state->blksize + 4) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    state->rx_time = time(NULL);
    break;

  case TFTP_EVENT_OACK:
    /* ACK option acknowledgement so we can move on to data */
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* we are ready to RX data */
    state->state = TFTP_STATE_RX;
    state->rx_time = time(NULL);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry count and fail if over the limit */
    state->retries++;
    infof(data,
          "Timeout waiting for block %d ACK. Retries = %d",
          NEXT_BLOCKNUM(state->block), state->retries);
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Resend the previous ACK */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      if(sbytes < 0) {
        failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
        return CURLE_SEND_ERROR;
      }
    }
    break;

  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data,
                 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* do not bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we are done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "%s", "tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL; /* not really the perfect return code for
                                  this */
  }
  return CURLE_OK;
}